

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O0

void recompute_shading_normals(mesh *mesh)

{
  size_t *psVar1;
  undefined8 *puVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  int iVar6;
  vec3 vVar7;
  vec3 vVar8;
  undefined8 local_f0;
  real_t local_e8;
  ulong local_c0;
  size_t i_2;
  real_t local_b0;
  size_t k;
  size_t j;
  vec3 geometry_normal;
  size_t i_1;
  real_t local_48;
  ulong local_30;
  size_t i;
  size_t index_stride;
  vec3 *normals;
  vec3 *geometry_normals;
  mesh *mesh_local;
  
  pvVar3 = mesh->attrs[2].data;
  pvVar4 = mesh->attrs[1].data;
  iVar6 = 4;
  if (mesh->type == TRI_MESH) {
    iVar6 = 3;
  }
  for (local_30 = 0; local_30 < mesh->vertex_count; local_30 = local_30 + 1) {
    psVar1 = (size_t *)((long)pvVar4 + local_30 * 0xc);
    vVar7 = const_vec3(0.0);
    i_1 = vVar7._._0_8_;
    local_48 = vVar7._[2];
    *psVar1 = i_1;
    *(real_t *)(psVar1 + 1) = local_48;
  }
  geometry_normal._[1] = 0.0;
  geometry_normal._[2] = 0.0;
  for (; (ulong)geometry_normal._._4_8_ < mesh->primitive_count;
      geometry_normal._._4_8_ = geometry_normal._._4_8_ + 1) {
    vVar7._ = *(real_t (*) [3])((long)pvVar3 + geometry_normal._._4_8_ * 0xc);
    for (k = 0; k < (ulong)(long)iVar6; k = k + 1) {
      sVar5 = mesh->indices[geometry_normal._._4_8_ * (long)iVar6 + k];
      psVar1 = (size_t *)((long)pvVar4 + sVar5 * 0xc);
      vVar8._[2] = *(real_t *)((long)pvVar4 + sVar5 * 0xc + 8);
      vVar8._._0_8_ = *(undefined8 *)((long)pvVar4 + sVar5 * 0xc);
      vVar8 = add_vec3(vVar8,vVar7);
      i_2 = vVar8._._0_8_;
      local_b0 = vVar8._[2];
      *psVar1 = i_2;
      *(real_t *)(psVar1 + 1) = local_b0;
    }
  }
  for (local_c0 = 0; local_c0 < mesh->vertex_count; local_c0 = local_c0 + 1) {
    puVar2 = (undefined8 *)((long)pvVar4 + local_c0 * 0xc);
    vVar7._[2] = *(real_t *)((long)pvVar4 + local_c0 * 0xc + 8);
    vVar7._._0_8_ = *(undefined8 *)((long)pvVar4 + local_c0 * 0xc);
    vVar7 = normalize_vec3(vVar7);
    local_f0 = vVar7._._0_8_;
    local_e8 = vVar7._[2];
    *puVar2 = local_f0;
    *(real_t *)(puVar2 + 1) = local_e8;
  }
  return;
}

Assistant:

void recompute_shading_normals(struct mesh* mesh) {
    const struct vec3* geometry_normals = mesh->attrs[ATTR_GEOMETRY_NORMAL].data;
    struct vec3* normals = mesh->attrs[ATTR_SHADING_NORMAL].data;
    size_t index_stride = mesh->type == TRI_MESH ? 3 : 4;
    for (size_t i = 0; i < mesh->vertex_count; ++i)
        normals[i] = const_vec3(0);
    for (size_t i = 0; i < mesh->primitive_count; i++) {
        const struct vec3 geometry_normal = geometry_normals[i];
        for (size_t j = 0; j < index_stride; ++j) {
            size_t k = mesh->indices[i * index_stride + j];
            normals[k] = add_vec3(normals[k], geometry_normal);
        }
    }
    for (size_t i = 0; i < mesh->vertex_count; ++i)
        normals[i] = normalize_vec3(normals[i]);
}